

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_d47da::____C_A_T_C_H____T_E_S_T____24::test(____C_A_T_C_H____T_E_S_T____24 *this)

{
  _Atomic_word *p_Var1;
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  _Atomic_word _Var6;
  Family id;
  EventSignalPtr *pEVar7;
  size_t sVar8;
  int iVar9;
  EventCallbackWrapper<entityx::EntityDestroyedEvent> wrapper;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> entities;
  EntityDestroyedEventReceiver receiver;
  undefined1 local_138 [16];
  _Manager_type local_128;
  _Invoker_type local_120;
  char *local_118;
  size_type local_110;
  Flags local_108;
  AssertionReaction local_100;
  bool local_fe;
  IResultCapture *local_f8;
  _Any_data local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  size_t local_d0;
  long local_c8;
  long local_c0;
  undefined1 local_b8 [9];
  undefined7 uStack_af;
  _Any_data *local_a8;
  _Invoker_type p_Stack_a0;
  undefined8 local_98;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> *local_90;
  undefined1 local_88 [8];
  __node_base_ptr *local_80;
  size_type local_78;
  __node_base local_70;
  size_type sStack_68;
  float local_60;
  size_t local_58;
  __node_base_ptr p_Stack_50;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> local_48;
  
  local_80 = &p_Stack_50;
  local_78 = 1;
  local_70._M_nxt = (_Hash_node_base *)0x0;
  sStack_68 = 0;
  local_60 = 1.0;
  local_58 = 0;
  p_Stack_50 = (__node_base_ptr)0x0;
  local_88 = (undefined1  [8])&PTR__EntityDestroyedEventReceiver_001f1360;
  local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  id = entityx::Event<entityx::EntityDestroyedEvent>::family();
  pEVar7 = entityx::EventManager::signal_for((EventManager *)this,id);
  this_00 = &((pEVar7->
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->
             super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>;
  this_01 = (pEVar7->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_b8._0_8_ = (void *)0x0;
  stack0xffffffffffffff50 = 0;
  local_a8 = (_Any_data *)0x0;
  p_Stack_a0 = (_Invoker_type)0x0;
  local_b8._0_8_ = operator_new(0x18);
  *(code **)local_b8._0_8_ =
       (anonymous_namespace)::____C_A_T_C_H____T_E_S_T____24::test()::EntityDestroyedEventReceiver::
       receive(entityx::EntityDestroyedEvent_const__;
  *(undefined8 *)(local_b8._0_8_ + 8) = 0;
  *(undefined1 **)(local_b8._0_8_ + 0x10) = local_88;
  p_Stack_a0 = Catch::clara::std::
               _Function_handler<void_(const_entityx::EntityDestroyedEvent_&),_std::_Bind<void_(EntityDestroyedEventReceiver::*(EntityDestroyedEventReceiver_*,_std::_Placeholder<1>))(const_entityx::EntityDestroyedEvent_&)>_>
               ::_M_invoke;
  local_a8 = (_Any_data *)
             Catch::clara::std::
             _Function_handler<void_(const_entityx::EntityDestroyedEvent_&),_std::_Bind<void_(EntityDestroyedEventReceiver::*(EntityDestroyedEventReceiver_*,_std::_Placeholder<1>))(const_entityx::EntityDestroyedEvent_&)>_>
             ::_M_manager;
  Catch::clara::std::function<void_(const_entityx::EntityDestroyedEvent_&)>::function
            ((function<void_(const_entityx::EntityDestroyedEvent_&)> *)local_138,
             (function<void_(const_entityx::EntityDestroyedEvent_&)> *)local_b8);
  if (local_a8 != (_Any_data *)0x0) {
    (*(code *)local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
  }
  std::function<void(void_const*)>::
  function<entityx::EventManager::EventCallbackWrapper<entityx::EntityDestroyedEvent>&,void>
            ((function<void(void_const*)> *)local_e8._M_pod_data,
             (EventCallbackWrapper<entityx::EntityDestroyedEvent> *)local_138);
  Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::ensure_ring
            (this_00);
  sVar8 = Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
          SignalLink::add_before(this_00->callback_ring_,(CbFunction *)&local_e8);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_d8)(&local_e8,&local_e8,3);
  }
  local_e8._M_unused._M_member_pointer = entityx::Event<entityx::EntityDestroyedEvent>::family();
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_weak_count = this_01->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_weak_count = this_01->_M_weak_count + 1;
    }
  }
  local_e8._8_8_ = this_00;
  local_d8 = this_01;
  local_d0 = sVar8;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_80,&local_e8);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &local_d8->_M_weak_count;
      _Var6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      _Var6 = local_d8->_M_weak_count;
      local_d8->_M_weak_count = _Var6 + -1;
    }
    if (_Var6 == 1) {
      (*local_d8->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_128 != (_Manager_type)0x0) {
    (*local_128)((_Any_data *)local_138,(_Any_data *)local_138,__destroy_functor);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_138._8_8_ = 7;
  local_138._0_8_ = "REQUIRE";
  local_128 = (_Manager_type)0x1c58b5;
  local_120 = (_Invoker_type)0x149;
  local_118 = "0UL == receiver.destroyed.size()";
  local_110 = 0x20;
  local_108 = Normal;
  local_100.shouldDebugBreak = false;
  local_100.shouldThrow = false;
  local_fe = false;
  local_f8 = Catch::getResultCapture();
  local_e8._M_unused._M_object = (void *)0x0;
  uStack_af._0_1_ =
       (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_start == 0;
  local_c8 = (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  local_b8[8] = 1;
  local_b8._0_8_ = &PTR_streamReconstructedExpression_001f36a0;
  p_Stack_a0 = (_Invoker_type)0x1c63fd;
  local_98 = 2;
  local_a8 = &local_e8;
  local_90 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&local_c8;
  (*local_f8->_vptr_IResultCapture[10])(local_f8,local_138);
  Catch::AssertionHandler::complete((AssertionHandler *)local_138);
  if (local_fe == false) {
    (*local_f8->_vptr_IResultCapture[0xe])();
  }
  local_e8._M_unused._M_object = (_Any_data *)0x0;
  local_e8._8_8_ = (_Any_data *)0x0;
  local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar9 = 10;
  do {
    local_138 = (undefined1  [16])
                entityx::EntityManager::create(&(this->super_EntityManagerFixture).em);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ == local_d8) {
      Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::
      _M_realloc_insert<entityx::Entity>
                ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&local_e8,
                 (iterator)local_e8._8_8_,(Entity *)local_138);
    }
    else {
      *(undefined8 *)local_e8._8_8_ = local_138._0_8_;
      ((Id *)(local_e8._8_8_ + 8))->id_ = local_138._8_8_;
      local_e8._8_8_ = local_e8._8_8_ + 0x10;
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  local_138._8_8_ = 7;
  local_138._0_8_ = "REQUIRE";
  local_128 = (_Manager_type)0x1c58b5;
  local_120 = (_Invoker_type)0x14e;
  local_118 = "0UL == receiver.destroyed.size()";
  local_110 = 0x20;
  local_108 = Normal;
  local_100.shouldDebugBreak = false;
  local_100.shouldThrow = false;
  local_fe = false;
  local_f8 = Catch::getResultCapture();
  uStack_af._0_1_ =
       (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_start == 0;
  local_c8 = 0;
  local_c0 = (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  local_b8[8] = 1;
  local_b8._0_8_ = &PTR_streamReconstructedExpression_001f36a0;
  p_Stack_a0 = (_Invoker_type)0x1c63fd;
  local_98 = 2;
  local_a8 = (_Any_data *)&local_c8;
  local_90 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&local_c0;
  (*local_f8->_vptr_IResultCapture[10])(local_f8,local_138);
  Catch::AssertionHandler::complete((AssertionHandler *)local_138);
  uVar2 = local_e8._M_unused._0_8_;
  uVar3 = local_e8._8_8_;
  if (local_fe == false) {
    (*local_f8->_vptr_IResultCapture[0xe])();
    uVar2 = local_e8._M_unused._0_8_;
    uVar3 = local_e8._8_8_;
  }
  for (; uVar4 = local_e8._8_8_, uVar2 != local_e8._8_8_; uVar2 = (_Any_data *)(uVar2 + 0x10)) {
    local_138 = *(undefined1 (*) [16])uVar2;
    local_e8._8_8_ = uVar3;
    entityx::Entity::destroy();
    uVar3 = local_e8._8_8_;
    local_e8._8_8_ = uVar4;
  }
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_128 = (_Manager_type)0x1c58b5;
  local_120 = (_Invoker_type)0x152;
  local_118 = "10UL == receiver.destroyed.size()";
  local_110 = 0x21;
  local_108 = Normal;
  local_100.shouldDebugBreak = false;
  local_100.shouldThrow = false;
  local_fe = false;
  local_e8._8_8_ = uVar3;
  local_f8 = Catch::getResultCapture();
  local_c0 = (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  uStack_af._0_1_ =
       (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
             super__Vector_impl_data._M_start == 0xa0;
  local_b8[8] = 1;
  local_c8 = 10;
  local_b8._0_8_ = &PTR_streamReconstructedExpression_001f36a0;
  p_Stack_a0 = (_Invoker_type)0x1c63fd;
  local_98 = 2;
  local_a8 = (_Any_data *)&local_c8;
  local_90 = (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&local_c0;
  (*local_f8->_vptr_IResultCapture[10])(local_f8,local_138);
  Catch::AssertionHandler::complete((AssertionHandler *)local_138);
  if (local_fe == false) {
    (*local_f8->_vptr_IResultCapture[0xe])();
  }
  local_138._8_8_ = 7;
  local_138._0_8_ = "REQUIRE";
  local_128 = (_Manager_type)0x1c58b5;
  local_120 = (_Invoker_type)0x153;
  local_118 = "entities == receiver.destroyed";
  local_110 = 0x1e;
  local_108 = Normal;
  local_100.shouldDebugBreak = false;
  local_100.shouldThrow = false;
  local_fe = false;
  local_f8 = Catch::getResultCapture();
  bVar5 = Catch::
          compareEqual<std::vector<entityx::Entity,std::allocator<entityx::Entity>>,std::vector<entityx::Entity,std::allocator<entityx::Entity>>>
                    ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)&local_e8,
                     &local_48);
  uStack_af._0_1_ = bVar5;
  local_b8[8] = 1;
  local_b8._0_8_ = &PTR_streamReconstructedExpression_001f3d48;
  p_Stack_a0 = (_Invoker_type)0x1c63fd;
  local_98 = 2;
  local_a8 = &local_e8;
  local_90 = &local_48;
  (*local_f8->_vptr_IResultCapture[10])(local_f8,local_138);
  Catch::AssertionHandler::complete((AssertionHandler *)local_138);
  if (local_fe == false) {
    (*local_f8->_vptr_IResultCapture[0xe])();
  }
  if ((_Any_data *)local_e8._M_unused._0_8_ != (_Any_data *)0x0) {
    operator_delete(local_e8._M_unused._M_object);
  }
  local_88 = (undefined1  [8])&PTR__EntityDestroyedEventReceiver_001f1360;
  if (local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  entityx::BaseReceiver::~BaseReceiver((BaseReceiver *)local_88);
  return;
}

Assistant:

void receive(const EntityDestroyedEvent &event) {
      destroyed.push_back(event.entity);
    }